

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O3

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  stbrp_node *psVar2;
  undefined1 auVar3 [16];
  stbrp_context *psVar4;
  uint uVar5;
  uint uVar6;
  stbrp_node *in_RAX;
  stbrp_node *extraout_RAX;
  stbrp_node *psVar7;
  stbrp_node *extraout_RAX_00;
  int iVar8;
  int *piVar9;
  stbrp_node *psVar10;
  stbrp_node **ppsVar11;
  stbrp_context *psVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  stbrp_rect *psVar16;
  int iVar17;
  int iVar18;
  size_t __nmemb;
  uint uVar19;
  ulong uVar20;
  stbrp_context *psVar21;
  stbrp_node **ppsVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int waste;
  uint local_94;
  uint local_90;
  int local_8c;
  stbrp_node **local_88;
  int local_68;
  int local_64;
  stbrp_node **local_60;
  ulong local_58;
  stbrp_rect *local_50;
  stbrp_node *local_48;
  size_t local_40;
  ulong local_38;
  
  auVar3 = _DAT_001a6970;
  uVar20 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    in_RAX = (stbrp_node *)(ulong)(num_rects + 1U & 0xfffffffe);
    lVar14 = uVar20 - 1;
    auVar23._8_4_ = (int)lVar14;
    auVar23._0_8_ = lVar14;
    auVar23._12_4_ = (int)((ulong)lVar14 >> 0x20);
    piVar9 = &rects->was_packed;
    psVar7 = (stbrp_node *)0x0;
    auVar23 = auVar23 ^ _DAT_001a6970;
    auVar24 = _DAT_001afc50;
    do {
      auVar25 = auVar24 ^ auVar3;
      if ((bool)(~(auVar25._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar25._0_4_ ||
                  auVar23._4_4_ < auVar25._4_4_) & 1)) {
        *piVar9 = (int)psVar7;
      }
      if ((auVar25._12_4_ != auVar23._12_4_ || auVar25._8_4_ <= auVar23._8_4_) &&
          auVar25._12_4_ <= auVar23._12_4_) {
        piVar9[6] = (int)psVar7 + 1;
      }
      psVar7 = (stbrp_node *)((long)&psVar7->x + 2);
      lVar14 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 2;
      auVar24._8_8_ = lVar14 + 2;
      piVar9 = piVar9 + 0xc;
    } while (in_RAX != psVar7);
  }
  __nmemb = (size_t)num_rects;
  if (1 < (uint)num_rects) {
    qsort(rects,__nmemb,0x18,rect_height_compare);
    in_RAX = extraout_RAX;
  }
  local_40 = __nmemb;
  local_38 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    ppsVar22 = &context->active_head;
    uVar13 = 0;
    local_60 = ppsVar22;
    local_58 = uVar20;
    local_50 = rects;
    do {
      psVar1 = rects + uVar13;
      uVar19 = psVar1->w;
      in_RAX = (stbrp_node *)(ulong)uVar19;
      lVar14 = 0xc;
      lVar15 = 0x10;
      if ((uVar19 == 0) || (iVar17 = psVar1->h, iVar17 == 0)) {
        uVar19 = 0;
        uVar5 = 0;
      }
      else {
        iVar8 = context->align;
        iVar18 = uVar19 + iVar8 + -1;
        iVar18 = iVar18 - iVar18 % iVar8;
        local_48 = in_RAX;
        if (iVar18 % iVar8 != 0) {
          __assert_fail("width % c->align == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_rectpack.h"
                        ,0x164,
                        "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)")
          ;
        }
        uVar19 = context->width;
        psVar7 = (stbrp_node *)(ulong)uVar19;
        if ((iVar18 <= (int)uVar19) && (iVar17 <= context->height)) {
          uVar5 = ((stbrp_context *)*ppsVar22)->width;
          psVar16 = psVar1;
          if ((int)uVar19 < (int)(uVar5 + iVar18)) {
            iVar8 = context->heuristic;
            local_94 = 0x40000000;
            local_8c = 0x40000000;
LAB_0016de10:
            local_88 = (stbrp_node **)0x0;
            local_90 = 0;
          }
          else {
            local_94 = 0x40000000;
            local_88 = (stbrp_node **)0x0;
            local_8c = 0x40000000;
            ppsVar11 = ppsVar22;
            psVar21 = (stbrp_context *)*ppsVar22;
            do {
              uVar19 = stbrp__skyline_find_min_y
                                 (psVar21,(stbrp_node *)(ulong)uVar5,iVar18,(int)&local_64,
                                  &psVar16->id);
              iVar8 = context->heuristic;
              if (iVar8 == 0) {
                if ((int)uVar19 < (int)local_94) {
                  local_94 = uVar19;
                  local_88 = ppsVar11;
                }
              }
              else if (((int)(iVar17 + uVar19) <= context->height) &&
                      (((int)uVar19 < (int)local_94 || (local_64 < local_8c && uVar19 == local_94)))
                      ) {
                local_8c = local_64;
                local_94 = uVar19;
                local_88 = ppsVar11;
              }
              ppsVar11 = (stbrp_node **)&psVar21->align;
              uVar5 = (*(stbrp_context **)&psVar21->align)->width;
              psVar21 = *(stbrp_context **)&psVar21->align;
            } while ((int)(uVar5 + iVar18) <= context->width);
            if (local_88 == (stbrp_node **)0x0) {
              psVar7 = (stbrp_node *)0x0;
              goto LAB_0016de10;
            }
            local_90 = (*local_88)->x;
            psVar7 = (stbrp_node *)(ulong)local_90;
          }
          if (iVar8 == 1) {
            psVar21 = (stbrp_context *)*ppsVar22;
            iVar8 = psVar21->width;
            psVar12 = psVar21;
            while (iVar8 < iVar18) {
              psVar12 = *(stbrp_context **)&psVar12->align;
              iVar8 = psVar12->width;
            }
            do {
              uVar19 = psVar12->width - iVar18;
              ppsVar11 = ppsVar22;
              psVar4 = psVar21;
              if ((int)uVar19 < 0) {
                __assert_fail("xpos >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_rectpack.h"
                              ,0x1a4,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              do {
                psVar21 = psVar4;
                ppsVar22 = ppsVar11;
                ppsVar11 = (stbrp_node **)&psVar21->align;
                psVar4 = *(stbrp_context **)&psVar21->align;
              } while ((*(stbrp_context **)&psVar21->align)->width <= (int)uVar19);
              if ((int)uVar19 < psVar21->width) {
                __assert_fail("node->next->x > xpos && node->x <= xpos",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_rectpack.h"
                              ,0x1aa,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              uVar5 = stbrp__skyline_find_min_y
                                (psVar21,(stbrp_node *)(ulong)uVar19,iVar18,(int)&local_68,
                                 &psVar16->id);
              psVar7 = (stbrp_node *)(ulong)uVar5;
              if ((((int)(iVar17 + uVar5) <= context->height) && ((int)uVar5 <= (int)local_94)) &&
                 (((uVar5 < local_94 || (local_68 < local_8c)) ||
                  ((local_68 == local_8c && ((int)uVar19 < (int)local_90)))))) {
                local_8c = local_68;
                local_94 = uVar5;
                local_90 = uVar19;
                local_88 = ppsVar22;
              }
              psVar12 = *(stbrp_context **)&psVar12->align;
            } while (psVar12 != (stbrp_context *)0x0);
          }
          rects = local_50;
          uVar20 = local_58;
          ppsVar22 = local_60;
          if (local_88 != (stbrp_node **)0x0) {
            uVar6 = iVar17 + local_94;
            in_RAX = (stbrp_node *)(ulong)uVar6;
            lVar14 = 0xc;
            lVar15 = 0x10;
            uVar19 = 0x7fffffff;
            if (context->height < (int)uVar6) {
              uVar5 = 0x7fffffff;
            }
            else {
              in_RAX = context->free_head;
              uVar5 = 0x7fffffff;
              if (in_RAX != (stbrp_node *)0x0) {
                in_RAX->x = local_90;
                in_RAX->y = uVar6;
                context->free_head = in_RAX->next;
                psVar7 = *local_88;
                psVar10 = psVar7;
                if (psVar7->x < (int)local_90) {
                  psVar10 = psVar7->next;
                  local_88 = &psVar7->next;
                }
                *local_88 = in_RAX;
                iVar17 = (int)local_48 + local_90;
                psVar7 = psVar10->next;
                while ((psVar2 = psVar7, psVar2 != (stbrp_node *)0x0 && (psVar2->x <= iVar17))) {
                  psVar10->next = context->free_head;
                  context->free_head = psVar10;
                  psVar10 = psVar2;
                  psVar7 = psVar2->next;
                }
                in_RAX->next = psVar10;
                lVar14 = 0x10;
                lVar15 = 0xc;
                uVar19 = local_90;
                uVar5 = local_94;
                if (psVar10->x < iVar17) {
                  psVar10->x = iVar17;
                }
              }
            }
            goto LAB_0016dd03;
          }
        }
        in_RAX = psVar7;
        lVar15 = 0x10;
        lVar14 = 0xc;
        uVar19 = 0x7fffffff;
        uVar5 = 0x7fffffff;
      }
LAB_0016dd03:
      *(uint *)((long)&psVar1->id + lVar15) = uVar19;
      *(uint *)((long)&psVar1->id + lVar14) = uVar5;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar20);
  }
  uVar19 = (uint)local_38;
  if (1 < uVar19) {
    qsort(rects,local_40,0x18,rect_original_order);
    in_RAX = extraout_RAX_00;
  }
  if (0 < (int)uVar19) {
    in_RAX = (stbrp_node *)(uVar20 * 0x18);
    lVar14 = 0;
    do {
      uVar19 = 1;
      if (*(int *)((long)&rects->x + lVar14) == 0x7fffffff) {
        uVar19 = (uint)(*(int *)((long)&rects->y + lVar14) != 0x7fffffff);
      }
      *(uint *)((long)&rects->was_packed + lVar14) = uVar19;
      lVar14 = lVar14 + 0x18;
    } while (in_RAX != (stbrp_node *)lVar14);
  }
  return (int)in_RAX;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}